

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool bssl::anon_unknown_0::InstallECHConfigList(SSL *client,SSL_ECH_KEYS *keys)

{
  int iVar1;
  bool bVar2;
  UniquePtr<uint8_t> free_ech_config_list;
  size_t ech_config_list_len;
  uint8_t *ech_config_list;
  _Head_base<0UL,_unsigned_char_*,_false> local_20;
  size_t local_18;
  _Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter> local_10;
  
  iVar1 = SSL_ECH_KEYS_marshal_retry_configs(keys,(uint8_t **)&local_10,&local_18);
  if (iVar1 == 0) {
    bVar2 = false;
  }
  else {
    local_20 = local_10.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    iVar1 = SSL_set1_ech_config_list
                      (client,(uint8_t *)
                              local_10.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                       local_18);
    bVar2 = iVar1 != 0;
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_20);
  }
  return bVar2;
}

Assistant:

static bool InstallECHConfigList(SSL *client, const SSL_ECH_KEYS *keys) {
  uint8_t *ech_config_list;
  size_t ech_config_list_len;
  if (!SSL_ECH_KEYS_marshal_retry_configs(keys, &ech_config_list,
                                          &ech_config_list_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_ech_config_list(ech_config_list);
  return SSL_set1_ech_config_list(client, ech_config_list, ech_config_list_len);
}